

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O1

int * Pdr_ManSortByPriority(Pdr_Man_t *p,Pdr_Set_t *pCube)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  piVar4 = p->pOrder;
  piVar5 = p->vPrio->pArray;
  iVar2 = pCube->nLits;
  uVar7 = (ulong)iVar2;
  if (0 < (long)uVar7) {
    uVar9 = 0;
    do {
      piVar4[uVar9] = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (1 < iVar2) {
    uVar10 = 1;
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      uVar8 = uVar9 & 0xffffffff;
      uVar11 = uVar10;
      do {
        uVar6 = uVar11 & 0xffffffff;
        if (piVar5[*(int *)(&pCube->field_0x14 + (long)piVar4[(int)uVar8] * 4) >> 1] <=
            piVar5[*(int *)(&pCube->field_0x14 + (long)piVar4[uVar11] * 4) >> 1]) {
          uVar6 = uVar8;
        }
        uVar8 = uVar6;
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
      iVar3 = piVar4[uVar9];
      piVar4[uVar9] = piVar4[(int)uVar8];
      piVar4[(int)uVar8] = iVar3;
      uVar10 = uVar10 + 1;
      uVar9 = uVar1;
    } while (uVar1 != iVar2 - 1);
  }
  return piVar4;
}

Assistant:

int * Pdr_ManSortByPriority( Pdr_Man_t * p, Pdr_Set_t * pCube )
{
    int * pPrios = Vec_IntArray(p->vPrio);
    int * pArray = p->pOrder;
    int temp, i, j, best_i, nSize = pCube->nLits;
    // initialize variable order
    for ( i = 0; i < nSize; i++ )
        pArray[i] = i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
//            if ( pArray[j] < pArray[best_i] )
            if ( pPrios[pCube->Lits[pArray[j]]>>1] < pPrios[pCube->Lits[pArray[best_i]]>>1] ) // list lower priority first (these will be removed first)
                best_i = j;
        temp = pArray[i];
        pArray[i] = pArray[best_i];
        pArray[best_i] = temp;
    }
/*
    for ( i = 0; i < pCube->nLits; i++ )
        Abc_Print( 1, "%2d : %5d    %5d  %5d\n", i, pArray[i], pCube->Lits[pArray[i]]>>1, pPrios[pCube->Lits[pArray[i]]>>1] );
    Abc_Print( 1, "\n" );
*/
    return pArray;
}